

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O1

Aig_Obj_t * Dar_RefactBuildGraph(Aig_Man_t *pAig,Vec_Ptr_t *vCut,Kit_Graph_t *pGraph)

{
  Kit_Node_t *pKVar1;
  long lVar2;
  Aig_Obj_t *pAVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  undefined1 *puVar8;
  
  if (pGraph->fConst == 0) {
    uVar5 = pGraph->nLeaves;
    if ((int)uVar5 < 1) {
      puVar8 = (undefined1 *)0x0;
    }
    else {
      lVar7 = 0;
      lVar2 = -0x18;
      do {
        lVar4 = lVar2;
        if (vCut->nSize <= lVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pKVar1 = pGraph->pNodes;
        *(void **)((long)&pKVar1[1].field_2 + lVar4) = vCut->pArray[lVar7];
        lVar7 = lVar7 + 1;
        uVar5 = pGraph->nLeaves;
        lVar2 = lVar4 + 0x18;
      } while (lVar7 < (int)uVar5);
      puVar8 = &pKVar1[1].eEdge0.field_0x0 + lVar4;
    }
    uVar6 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
    if (uVar6 < uVar5) {
      pAVar3 = (Aig_Obj_t *)
               ((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pGraph->pNodes[uVar6].field_2.pFunc);
    }
    else {
      if ((int)uVar5 < pGraph->nSize) {
        lVar7 = (long)(int)uVar5;
        lVar2 = lVar7 * 0x18 + -0x18;
        do {
          lVar4 = lVar2;
          pKVar1 = pGraph->pNodes;
          uVar5 = *(uint *)(&pKVar1[1].eEdge0.field_0x0 + lVar4);
          uVar6 = *(uint *)(&pKVar1[1].eEdge1.field_0x0 + lVar4);
          pAVar3 = Aig_And(pAig,(Aig_Obj_t *)
                                ((ulong)(uVar5 & 1) ^
                                (ulong)pKVar1[uVar5 >> 1 & 0x3fffffff].field_2.pFunc),
                           (Aig_Obj_t *)
                           ((ulong)(uVar6 & 1) ^
                           (ulong)pKVar1[uVar6 >> 1 & 0x3fffffff].field_2.pFunc));
          *(Aig_Obj_t **)((long)&pKVar1[1].field_2 + lVar4) = pAVar3;
          lVar7 = lVar7 + 1;
          lVar2 = lVar4 + 0x18;
        } while (lVar7 < pGraph->nSize);
        puVar8 = &pKVar1[1].eEdge0.field_0x0 + lVar4;
      }
      pAVar3 = (Aig_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ *(ulong *)(puVar8 + 8));
    }
  }
  else {
    pAVar3 = (Aig_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pAig->pConst1);
  }
  return pAVar3;
}

Assistant:

Aig_Obj_t * Dar_RefactBuildGraph( Aig_Man_t * pAig, Vec_Ptr_t * vCut, Kit_Graph_t * pGraph )
{
    Aig_Obj_t * pAnd0, * pAnd1;
    Kit_Node_t * pNode = NULL;
    int i;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Aig_NotCond( Aig_ManConst1(pAig), Kit_GraphIsComplement(pGraph) );
    // set the leaves
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Vec_PtrEntry(vCut, i);
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Aig_NotCond( (Aig_Obj_t *)Kit_GraphVar(pGraph)->pFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
//printf( "Building (current number %d):\n", Aig_ManObjNumMax(pAig) );
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Aig_And( pAig, pAnd0, pAnd1 );
/*
printf( "Checking " );
Ref_ObjPrint( pAnd0 );
printf( " and " );
Ref_ObjPrint( pAnd1 );
printf( "  Result " );
Ref_ObjPrint( pNode->pFunc );
printf( "\n" );
*/
    }
    // complement the result if necessary
    return Aig_NotCond( (Aig_Obj_t *)pNode->pFunc, Kit_GraphIsComplement(pGraph) );
}